

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scapp.h
# Opt level: O3

void __thiscall scApp::captureOption(scApp *this,argparser *parser,HasArg hasArg)

{
  pointer pbVar1;
  _Alloc_hider _Var2;
  int iVar3;
  uint uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_38 [2];
  long local_28 [2];
  
  if ((hasArg == eRequired) ||
     ((iVar3 = -1, hasArg == eOptional && ((parser->optarg)._M_string_length != 0)))) {
    iVar3 = -2;
  }
  uVar4 = iVar3 + parser->optind;
  pbVar1 = (parser->argv).
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  _Var2._M_p = pbVar1[uVar4]._M_dataplus._M_p;
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_38,_Var2._M_p,_Var2._M_p + pbVar1[uVar4]._M_string_length);
  std::__cxx11::string::append((char *)local_38);
  std::__cxx11::string::_M_append((char *)&this->scparams,(ulong)local_38[0]);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return;
}

Assistant:

void
scApp::captureOption(const argparser& parser, HasArg hasArg)
{
    uint32_t indexDecrement = 1;
    bool captureArg = false;

    if ((hasArg == eOptional && parser.optarg.size() > 0) || hasArg == eRequired)
        indexDecrement = 2;
    scparams += parser.argv[parser.optind - indexDecrement] + " ";
    if (captureArg)
        scparams += parser.optarg + " ";
}